

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# displacement_geometry_device.cpp
# Opt level: O3

Vec3fa __thiscall
embree::renderPixelStandard(embree *this,float x,float y,ISPCCamera *camera,RayStats *stats)

{
  undefined8 uVar1;
  undefined8 uVar2;
  float fVar3;
  undefined1 auVar4 [16];
  float fVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  undefined1 auVar10 [16];
  Vec3fa VVar11;
  Vec3fa diffuse;
  float local_138;
  float fStack_134;
  undefined1 local_e8 [8];
  float fStack_e0;
  float local_d8;
  float fStack_d4;
  float fStack_d0;
  undefined4 uStack_cc;
  undefined8 local_c8;
  float local_b8;
  undefined8 local_b4;
  undefined4 local_a4;
  int iStack_a0;
  undefined4 uStack_9c;
  undefined4 uStack_98;
  float local_88;
  float fStack_84;
  float fStack_80;
  undefined4 uStack_7c;
  float local_78;
  float fStack_74;
  float fStack_70;
  undefined4 uStack_6c;
  undefined8 local_68;
  undefined4 local_44;
  undefined4 uStack_40;
  undefined4 uStack_3c;
  undefined4 uStack_38;
  
  local_d8 = (camera->xfm).l.vy.field_0.field_0.x * y + (camera->xfm).l.vx.field_0.field_0.x * x +
             (camera->xfm).l.vz.field_0.field_0.x;
  auVar10._0_8_ = *(undefined8 *)((long)&(camera->xfm).l.vx.field_0 + 4);
  uVar1 = *(undefined8 *)((long)&(camera->xfm).l.vy.field_0 + 4);
  uVar2 = *(undefined8 *)((long)&(camera->xfm).l.vz.field_0 + 4);
  fVar5 = y * (float)uVar1 + (float)auVar10._0_8_ * x + (float)uVar2;
  fVar6 = y * (float)((ulong)uVar1 >> 0x20) + (float)((ulong)auVar10._0_8_ >> 0x20) * x +
          (float)((ulong)uVar2 >> 0x20);
  fVar3 = local_d8 * local_d8 + fVar5 * fVar5 + fVar6 * fVar6;
  auVar10 = rsqrtss(ZEXT416((uint)fVar3),ZEXT416((uint)fVar3));
  fVar7 = auVar10._0_4_;
  fStack_d0 = fVar7 * 1.5 - fVar7 * fVar7 * fVar3 * 0.5 * fVar7;
  local_d8 = local_d8 * fStack_d0;
  fStack_d4 = fStack_d0 * fVar5;
  fStack_d0 = fStack_d0 * fVar6;
  fStack_e0 = (float)(int)((ulong)*(undefined8 *)((long)&(camera->xfm).p.field_0 + 4) >> 0x20);
  local_e8 = *(undefined8 *)&(camera->xfm).p.field_0;
  register0x0000128c = 0;
  uStack_cc = 0;
  local_c8 = 0xffffffff7f800000;
  local_a4 = 0xffffffff;
  iStack_a0 = -1;
  uStack_9c = 0xffffffff;
  uStack_98 = 0xffffffff;
  rtcIntersect1(g_scene,local_e8,0);
  stats->numRays = stats->numRays + 1;
  auVar10._0_8_ = 0;
  *(undefined1 (*) [16])this = (undefined1  [16])0x0;
  local_68._0_4_ = fVar5;
  if (iStack_a0 != -1) {
    if (iStack_a0 == 0) {
      fVar3 = 0.8;
      fVar5 = 0.0;
      fVar7 = 0.0;
    }
    else {
      fVar3 = 0.9;
      fVar5 = 0.6;
      fVar7 = 0.5;
    }
    auVar4._0_4_ = fVar3 * 0.5;
    auVar4._4_4_ = fVar5 * 0.5;
    auVar4._8_4_ = fVar7 * 0.5;
    auVar4._12_4_ = 0;
    *(float *)this = auVar4._0_4_ + 0.0;
    *(float *)(this + 4) = auVar4._4_4_ + 0.0;
    *(float *)(this + 8) = auVar4._8_4_ + 0.0;
    *(undefined4 *)(this + 0xc) = 0;
    auVar10 = rsqrtss(auVar4,0x40400000);
    fVar6 = auVar10._0_4_;
    fVar8 = fVar6 * 1.5 - fVar6 * fVar6 * fVar6 * 1.5;
    local_88 = (float)local_c8 * local_d8 + (float)local_e8._0_4_;
    fStack_84 = (float)local_c8 * fStack_d4 + (float)local_e8._4_4_;
    fStack_80 = (float)local_c8 * fStack_d0 + fStack_e0;
    local_78 = -(fVar8 * -1.0);
    fStack_74 = -(fVar8 * -1.0);
    fStack_70 = -(fVar8 * -1.0);
    uStack_7c = 0x3a83126f;
    uStack_6c = 0;
    local_68 = 0xffffffff7f800000;
    local_44 = 0xffffffff;
    uStack_40 = 0xffffffff;
    uStack_3c = 0xffffffff;
    uStack_38 = 0xffffffff;
    rtcOccluded1(g_scene,&local_88,0);
    stats->numRays = stats->numRays + 1;
    fVar6 = 0.0;
    auVar10._0_8_ = 0;
    if (0.0 <= (float)local_68) {
      local_138 = (float)local_b4;
      fStack_134 = (float)((ulong)local_b4 >> 0x20);
      fVar6 = local_b8 * local_b8 + local_138 * local_138 + fStack_134 * fStack_134;
      auVar10 = rsqrtss(ZEXT416((uint)fVar6),ZEXT416((uint)fVar6));
      fVar9 = auVar10._0_4_;
      fVar6 = fVar9 * fVar9 * fVar6 * -0.5 * fVar9 + fVar9 * 1.5;
      fVar6 = -(fVar8 * -1.0 * fVar6 * fStack_134 +
               fVar8 * -1.0 * fVar6 * local_138 + fVar8 * -1.0 * local_b8 * fVar6);
      if (1.0 <= fVar6) {
        fVar6 = 1.0;
      }
      fVar8 = 0.0;
      if (0.0 <= fVar6) {
        fVar8 = fVar6;
      }
      local_68._0_4_ = fVar3 * fVar8;
      fVar6 = fVar5 * fVar8;
      auVar10._0_8_ = CONCAT44(auVar4._4_4_ + 0.0 + fVar6,auVar4._0_4_ + 0.0 + (float)local_68);
      auVar10._8_4_ = auVar4._8_4_ + 0.0 + fVar7 * fVar8;
      auVar10._12_4_ = fVar8 * 0.0 + 0.0;
      *(undefined1 (*) [16])this = auVar10;
    }
  }
  VVar11.field_0.m128[3] = fVar6;
  VVar11.field_0.m128[2] = (float)local_68;
  VVar11.field_0._0_8_ = auVar10._0_8_;
  return (Vec3fa)VVar11.field_0;
}

Assistant:

Vec3fa renderPixelStandard(float x, float y, const ISPCCamera& camera, RayStats& stats)
{
  /* initialize ray */
  Ray ray(Vec3fa(camera.xfm.p), Vec3fa(normalize(x*camera.xfm.l.vx + y*camera.xfm.l.vy + camera.xfm.l.vz)), 0.0f, inf);

  /* intersect ray with scene */
  rtcIntersect1(g_scene,RTCRayHit_(ray));
  RayStats_addRay(stats);

  /* shade pixels */
  Vec3fa color = Vec3fa(0.0f);
  if (ray.geomID != RTC_INVALID_GEOMETRY_ID)
  {
    Vec3fa diffuse = ray.geomID != 0 ? Vec3fa(0.9f,0.6f,0.5f) : Vec3fa(0.8f,0.0f,0.0f);
    color = color + diffuse*0.5f;
    Vec3fa lightDir = normalize(Vec3fa(-1,-1,-1));

    Vec3fa Ng = normalize(ray.Ng);
#if ENABLE_SMOOTH_NORMALS
    Vec3fa P = ray.org + ray.tfar*ray.dir;
    if (ray.geomID > 0) {
      Vec3fa dPdu,dPdv;
      auto geomID = ray.geomID; {
        rtcInterpolate1(rtcGetGeometry(g_scene,geomID),ray.primID,ray.u,ray.v,RTC_BUFFER_TYPE_VERTEX,0,nullptr,&dPdu.x,&dPdv.x,3);
      }
      Ng = normalize(cross(dPdu,dPdv));
      dPdu = dPdu + Ng*displacement_du(P,dPdu);
      dPdv = dPdv + Ng*displacement_dv(P,dPdv);
      Ng = normalize(cross(dPdu,dPdv));
    }
#endif

    /* initialize shadow ray */
    Ray shadow(ray.org + ray.tfar*ray.dir, neg(lightDir), 0.001f, inf, 0.0f);

    /* trace shadow ray */
    rtcOccluded1(g_scene,RTCRay_(shadow));
    RayStats_addShadowRay(stats);

    /* add light contribution */
    if (shadow.tfar >= 0.0f)
      color = color + diffuse*clamp(-(dot(lightDir,Ng)),0.0f,1.0f);
  }
  return color;
}